

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

uint __thiscall
TArray<DVector3a,_DVector3a>::Push(TArray<DVector3a,_DVector3a> *this,DVector3a *item)

{
  uint uVar1;
  DVector3a *item_local;
  TArray<DVector3a,_DVector3a> *this_local;
  
  Grow(this,1);
  DVector3a::DVector3a(this->Array + this->Count,item);
  uVar1 = this->Count;
  this->Count = uVar1 + 1;
  return uVar1;
}

Assistant:

unsigned int Push (const T &item)
	{
		Grow (1);
		::new((void*)&Array[Count]) T(item);
		return Count++;
	}